

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::TAPReporter::testRunStarting(TAPReporter *this,TestRunInfo *param_1)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  undefined4 extraout_var_00;
  
  iVar1 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[0xd])();
  if (*(long *)CONCAT44(extraout_var,iVar1) != ((long *)CONCAT44(extraout_var,iVar1))[1]) {
    poVar2 = std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,
                             "# filters: ");
    iVar1 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)
              ->_vptr_IConfig[0xd])();
    TestSpec::serializeTo((TestSpec *)CONCAT44(extraout_var_00,iVar1),poVar2);
    std::operator<<(poVar2,'\n');
  }
  poVar2 = std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,
                           "# rng-seed: ");
  (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
    _vptr_IConfig[0x11])();
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,'\n');
  return;
}

Assistant:

void TAPReporter::testRunStarting( TestRunInfo const& ) {
        if ( m_config->testSpec().hasFilters() ) {
            m_stream << "# filters: " << m_config->testSpec() << '\n';
        }
        m_stream << "# rng-seed: " << m_config->rngSeed() << '\n';
    }